

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.c
# Opt level: O2

void expfilter(double *sig,int N,double alpha,double *oup)

{
  long lVar1;
  
  *oup = *sig;
  for (lVar1 = 1; lVar1 < N; lVar1 = lVar1 + 1) {
    oup[lVar1] = sig[lVar1] * alpha + oup[lVar1 + -1] * (1.0 - alpha);
  }
  return;
}

Assistant:

void expfilter(double *sig,int N, double alpha,double *oup) {
	int i;
	double beta;
	
	/* alpha accepts values between 0 and 1.
	 * No error check is implemented presently
	 * so make sure that the correct value of 
	 * alpha is entered.  
	 */ 
	beta = 1.0 - alpha;
	
	oup[0] = sig[0];
	
	for (i = 1; i < N; ++i) {
		oup[i] = alpha * sig[i] + beta * oup[i-1];
	}
}